

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

int __thiscall despot::option::Option::init(Option *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Option *pOVar2;
  char *in_RCX;
  char *in_RDX;
  char *pcVar3;
  
  this->desc = (Descriptor *)ctx;
  this->name = in_RDX;
  this->arg = in_RCX;
  pOVar2 = (Option *)((ulong)this | 1);
  this->prev_ = pOVar2;
  this->next_ = pOVar2;
  this->namelen = 0;
  if ((in_RDX != (char *)0x0) && (this->namelen = 1, *in_RDX == '-')) {
    uVar1 = this->namelen;
    pcVar3 = in_RDX + (int)uVar1;
    while( true ) {
      uVar1 = uVar1 + 1;
      pOVar2 = (Option *)(ulong)uVar1;
      if ((*pcVar3 == '\0') || (*pcVar3 == '=')) break;
      this->namelen = uVar1;
      pcVar3 = pcVar3 + 1;
    }
  }
  return (int)pOVar2;
}

Assistant:

void init(const Descriptor* desc_, const char* name_, const char* arg_) {
		desc = desc_;
		name = name_;
		arg = arg_;
		prev_ = tag(this);
		next_ = tag(this);
		namelen = 0;
		if (name == 0)
			return;
		namelen = 1;
		if (name[0] != '-')
			return;
		while (name[namelen] != 0 && name[namelen] != '=')
			++namelen;
	}